

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall Js::InterpreterStackFrame::ProcessLinkFailedAsmJsModule(InterpreterStackFrame *this)

{
  ulong uVar1;
  byte bVar2;
  ImplicitCallFlags flags;
  void *returnAddress;
  void *addressOfReturnAddress;
  ScriptContext *this_00;
  DynamicProfileInfo *this_01;
  ScriptFunction *pSVar3;
  ExecutionMode EVar4;
  bool bVar5;
  bool bVar6;
  AsmJsModuleInfo *pAVar7;
  FunctionBody *pFVar8;
  undefined7 extraout_var;
  ByteCodeReader *this_02;
  Var pvVar9;
  ByteCodeReader *pBVar10;
  Var *stackAllocation;
  ulong uVar11;
  PVOID unaff_retaddr;
  undefined1 local_b8 [8];
  Setup setup;
  PushPopFrameHelper pushPopFrameHelper;
  ByteCodeReader local_58;
  DynamicProfileInfo *local_40;
  ScriptFunction *local_38;
  ScriptFunction *funcObj;
  
  pBVar10 = (ByteCodeReader *)local_b8;
  AsmJSCompiler::OutputError(*(ScriptContext **)(this + 0x78),L"asm.js linking failed.");
  pAVar7 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)3,Js::AsmJsModuleInfo*>
                     (*(FunctionProxy **)(this + 0x88));
  if (pAVar7->mIsProcessed == true) {
    Throw::OutOfMemory();
  }
  local_38 = *(ScriptFunction **)(this + 0x80);
  JavascriptFunction::ReparseAsmJsModule(&local_38);
  pFVar8 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_38);
  EVar4 = FunctionBody::GetInterpreterExecutionMode(pFVar8,false);
  if (EVar4 == ProfilingInterpreter) {
LAB_008aa69c:
    pFVar8 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_38);
    local_40 = FunctionBody::GetDynamicProfileInfo(pFVar8);
    ThreadContext::ClearImplicitCallFlags
              (((((((local_38->super_ScriptFunctionBase).super_JavascriptFunction.
                    super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr)->threadContext);
    bVar5 = true;
  }
  else {
    pFVar8 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_38);
    bVar5 = FunctionProxy::IsInDebugMode((FunctionProxy *)pFVar8);
    if (bVar5) {
      pFVar8 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_38);
      bVar5 = DynamicProfileInfo::IsEnabled(pFVar8);
      if (bVar5) goto LAB_008aa69c;
    }
    bVar5 = false;
    local_40 = (DynamicProfileInfo *)0x0;
  }
  Setup::Setup((Setup *)local_b8,local_38,*(Var **)(this + 0x20),*(int *)(this + 0x18));
  uVar11 = (ulong)setup.localCount;
  uVar1 = uVar11 + (uint)setup.inSlotsCount;
  if (uVar1 < 0x8001) {
    ThreadContext::ProbeStack
              ((*(ScriptContext **)(this + 0x78))->threadContext,uVar1 * 8 + 0x4000,
               *(ScriptContext **)(this + 0x78),unaff_retaddr);
    pBVar10 = (ByteCodeReader *)(local_b8 + -(uVar1 * 8 + 0xf & 0xfffffffffffffff0));
    local_58.m_endLocation = (byte *)0x0;
    stackAllocation = (Var *)0x0;
    this_02 = pBVar10;
    local_58.m_startLocation = (byte *)pBVar10;
    local_58.m_currentLocation = (byte *)pBVar10;
  }
  else {
    setup.bailedOut = false;
    setup.bailedOutOfInlinee = false;
    setup.isGeneratorFrame = false;
    setup._59_5_ = 0;
    bVar6 = ScriptContext::EnsureInterpreterArena
                      (*(ScriptContext **)(this + 0x78),(ArenaAllocator **)&setup.bailedOut);
    local_58.m_endLocation = (byte *)CONCAT71(extraout_var,bVar6);
    this_02 = (ByteCodeReader *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            setup._56_8_,(ulong)(uint)setup.inSlotsCount << 3);
    local_58.m_startLocation = (byte *)this_02;
    if (uVar11 == 0) {
      stackAllocation = (Var *)0x0;
    }
    else {
      ThreadContext::ProbeStack
                ((*(ScriptContext **)(this + 0x78))->threadContext,uVar11 * 8 + 0x4000,
                 *(ScriptContext **)(this + 0x78),unaff_retaddr);
      pBVar10 = (ByteCodeReader *)(local_b8 + -(uVar11 * 8 + 0xf & 0xfffffffffffffff0));
      stackAllocation = (Var *)pBVar10;
    }
    local_58.m_currentLocation = (byte *)&local_58;
  }
  pBVar10[-1].m_currentLocation = (byte *)0xfefefefefefefefe;
  pBVar10[-1].m_endLocation = (byte *)0xfefefefefefefefe;
  pSVar3 = local_38;
  pBVar10[-1].m_startLocation = (byte *)0x8aa814;
  pFVar8 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar3);
  bVar2 = (pFVar8->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
  pBVar10[-1].m_startLocation = (byte *)&pBVar10[-1].m_currentLocation;
  pBVar10[-2].m_endLocation = local_58.m_currentLocation;
  pBVar10[-2].m_currentLocation = (byte *)0x8aa841;
  Setup::InitializeAllocation
            ((Setup *)local_b8,&this_02->m_startLocation,stackAllocation,(bool)((bVar2 & 4) >> 2),
             bVar5,(LoopHeader *)0x0,(DWORD_PTR)pBVar10[-2].m_endLocation,
             pBVar10[-1].m_startLocation);
  pSVar3 = local_38;
  pBVar10[-1].m_startLocation = (byte *)0x8aa84e;
  pFVar8 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar3);
  pBVar10[-1].m_startLocation = (byte *)0x8aa85b;
  ByteCodeReader::Create(this_02,pFVar8,0);
  pSVar3 = local_38;
  pBVar10[-1].m_startLocation = (byte *)0x8aa864;
  pFVar8 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar3);
  pBVar10[-1].m_startLocation = (byte *)0x8aa86c;
  FunctionBody::BeginExecution(pFVar8);
  returnAddress = *(void **)(this + 0x98);
  addressOfReturnAddress = *(void **)(this + 0xa0);
  pBVar10[-1].m_startLocation = (byte *)0x8aa886;
  PushPopFrameHelper::PushPopFrameHelper
            ((PushPopFrameHelper *)&setup.bailedOut,(InterpreterStackFrame *)this_02,returnAddress,
             addressOfReturnAddress);
  pBVar10[-1].m_startLocation = (byte *)0x8aa88e;
  pvVar9 = ProcessUnprofiled((InterpreterStackFrame *)this_02);
  this_01 = local_40;
  if (bVar5 != false) {
    flags = *(ImplicitCallFlags *)(*(long *)(*(long *)(this + 0x78) + 0x3b8) + 0x1570);
    pBVar10[-1].m_startLocation = (byte *)0x8aa8b1;
    DynamicProfileInfo::RecordImplicitCallFlags(this_01,flags);
  }
  if ((char)local_58.m_endLocation != '\0') {
    this_00 = *(ScriptContext **)(this + 0x78);
    pBVar10[-1].m_startLocation = (byte *)0x8aa8c0;
    ScriptContext::ReleaseInterpreterArena(this_00);
  }
  pBVar10[-1].m_startLocation = (byte *)0x8aa8c9;
  PushPopFrameHelper::~PushPopFrameHelper((PushPopFrameHelper *)&setup.bailedOut);
  return pvVar9;
}

Assistant:

Var InterpreterStackFrame::ProcessLinkFailedAsmJsModule()
    {
        AsmJSCompiler::OutputError(this->scriptContext, _u("asm.js linking failed."));

        Js::FunctionBody* asmJsModuleFunctionBody = GetFunctionBody();
        AsmJsModuleInfo* info = asmJsModuleFunctionBody->GetAsmJsModuleInfo();

        // do not support relinking with failed relink
        if (info->IsRuntimeProcessed())
        {
            Js::Throw::OutOfMemory();
        }

        ScriptFunction * funcObj = GetJavascriptFunction();
        ScriptFunction::ReparseAsmJsModule(&funcObj);
        const bool doProfile =
            funcObj->GetFunctionBody()->GetInterpreterExecutionMode(false) == ExecutionMode::ProfilingInterpreter ||
            (funcObj->GetFunctionBody()->IsInDebugMode() && DynamicProfileInfo::IsEnabled(funcObj->GetFunctionBody()));

        DynamicProfileInfo * dynamicProfileInfo = nullptr;
        if (doProfile)
        {
            dynamicProfileInfo = funcObj->GetFunctionBody()->GetDynamicProfileInfo();
            funcObj->GetScriptContext()->GetThreadContext()->ClearImplicitCallFlags();
        }

        // after reparsing, we want to also use a new interpreter stack frame, as it will have different characteristics than the asm.js version
        InterpreterStackFrame::Setup setup(funcObj, m_inParams, m_inSlotsCount);
        size_t varAllocCount = setup.GetAllocationVarCount();
        size_t stackVarAllocCount = setup.GetStackAllocationVarCount();
        size_t varSizeInBytes;

        Var* allocation = nullptr;
        Var* stackAllocation = nullptr;
        DWORD_PTR stackAddr;
        bool fReleaseAlloc = false;
        if ((varAllocCount + stackVarAllocCount) > InterpreterStackFrame::LocalsThreshold)
        {
            ArenaAllocator *tmpAlloc = nullptr;
            fReleaseAlloc = GetScriptContext()->EnsureInterpreterArena(&tmpAlloc);
            varSizeInBytes = varAllocCount * sizeof(Var);
            allocation = (Var*)tmpAlloc->Alloc(varSizeInBytes);
            if (stackVarAllocCount != 0)
            {
                size_t stackVarSizeInBytes = stackVarAllocCount * sizeof(Var);
                PROBE_STACK_PARTIAL_INITIALIZED_INTERPRETER_FRAME(GetScriptContext(), Js::Constants::MinStackInterpreter + stackVarSizeInBytes);
                stackAllocation = (Var*)_alloca(stackVarSizeInBytes);
            }
            // use a stack address so the debugger stepping logic works (step-out, for example, compares stack depths to determine when to complete the step)
            // debugger stepping does not matter here, but it's worth being consistent with normal stack frame
            stackAddr = reinterpret_cast<DWORD_PTR>(&allocation);
        }
        else
        {
            varSizeInBytes = (varAllocCount + stackVarAllocCount) * sizeof(Var);
            PROBE_STACK_PARTIAL_INITIALIZED_INTERPRETER_FRAME(GetScriptContext(), Js::Constants::MinStackInterpreter + varSizeInBytes);
            allocation = (Var*)_alloca(varSizeInBytes);
            stackAddr = reinterpret_cast<DWORD_PTR>(allocation);
        }

#if DBG
        Var invalidStackVar = (Js::RecyclableObject*)_alloca(sizeof(Js::RecyclableObject));
        memset(invalidStackVar, 0xFE, sizeof(Js::RecyclableObject));
#endif

        InterpreterStackFrame * newInstance = setup.InitializeAllocation(allocation, stackAllocation, funcObj->GetFunctionBody()->GetHasImplicitArgIns(), doProfile, nullptr, stackAddr
#if DBG
            , invalidStackVar
#endif
            );

        newInstance->m_reader.Create(funcObj->GetFunctionBody());
        // now that we have set up the new frame, let's interpret it!
        funcObj->GetFunctionBody()->BeginExecution();

        PushPopFrameHelper pushPopFrameHelper(newInstance, this->returnAddress, this->addressOfReturnAddress);
        Var retVal = newInstance->ProcessUnprofiled();

        if (doProfile)
        {
            dynamicProfileInfo->RecordImplicitCallFlags(GetScriptContext()->GetThreadContext()->GetImplicitCallFlags());
        }

        if (fReleaseAlloc)
        {
            GetScriptContext()->ReleaseInterpreterArena();
        }

        return retVal;
    }